

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O3

Vec_Ptr_t *
Llb_ImgSupports(Aig_Man_t *p,Vec_Ptr_t *vDdMans,Vec_Int_t *vStart,Vec_Int_t *vStop,int fAddPis,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  DdHalfWord DVar3;
  int *piVar4;
  DdManager *dd;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int *piVar8;
  long lVar9;
  void *pvVar10;
  DdNode *n;
  DdNode *pDVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  char *__format;
  ulong uVar19;
  DdNode *pDVar20;
  ulong local_80;
  
  if (vDdMans->nSize < 1) {
LAB_0082e89b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar5 = Cudd_ReadSize((DdManager *)*vDdMans->pArray);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  piVar8 = (int *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar18 = iVar5;
  }
  *piVar8 = iVar18;
  lVar9 = (long)iVar18;
  if (iVar18 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc(lVar9 * 4);
  }
  *(void **)(piVar8 + 2) = pvVar10;
  piVar8[1] = iVar5;
  sVar15 = (long)iVar5 << 2;
  memset(pvVar10,0,sVar15);
  iVar1 = vStart->nSize;
  if (0 < (long)iVar1) {
    piVar4 = vStart->pArray;
    lVar16 = 0;
    do {
      iVar2 = piVar4[lVar16];
      if (((long)iVar2 < 0) || (iVar5 <= iVar2)) goto LAB_0082e85d;
      *(undefined4 *)((long)pvVar10 + (long)iVar2 * 4) = 1;
      lVar16 = lVar16 + 1;
    } while (iVar1 != lVar16);
  }
  pVVar6->nSize = 1;
  *ppvVar7 = piVar8;
  if (vDdMans->nSize < 1) {
    uVar14 = 1;
    local_80._0_4_ = 100;
  }
  else {
    local_80 = 100;
    lVar16 = 0;
    uVar13 = 1;
    do {
      dd = (DdManager *)vDdMans->pArray[lVar16];
      piVar8 = (int *)malloc(0x10);
      *piVar8 = iVar18;
      if (iVar18 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = malloc(lVar9 * 4);
      }
      *(void **)(piVar8 + 2) = pvVar10;
      piVar8[1] = iVar5;
      memset(pvVar10,0,sVar15);
      n = Cudd_Support(dd,dd->bFunc);
      Cudd_Ref(n);
      pDVar11 = Cudd_ReadOne(dd);
      pDVar20 = n;
      if (n != pDVar11) {
        do {
          DVar3 = pDVar20->index;
          if (((long)(int)DVar3 < 0) || (piVar8[1] <= (int)DVar3)) goto LAB_0082e85d;
          *(undefined4 *)(*(long *)(piVar8 + 2) + (long)(int)DVar3 * 4) = 1;
          pDVar20 = (pDVar20->type).kids.T;
          pDVar11 = Cudd_ReadOne(dd);
        } while (pDVar20 != pDVar11);
      }
      Cudd_RecursiveDeref(dd,n);
      uVar14 = (uint)local_80;
      if (uVar13 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = 0x10;
          local_80 = 0x10;
        }
        else {
          local_80 = (ulong)(uVar14 * 2);
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(local_80 * 8);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,local_80 * 8);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = uVar14 * 2;
        }
      }
      else {
        ppvVar7 = pVVar6->pArray;
      }
      uVar14 = uVar13 + 1;
      pVVar6->nSize = uVar14;
      ppvVar7[uVar13] = piVar8;
      lVar16 = lVar16 + 1;
      uVar13 = uVar14;
    } while (lVar16 < vDdMans->nSize);
  }
  piVar8 = (int *)malloc(0x10);
  *piVar8 = iVar18;
  if (iVar18 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc(lVar9 << 2);
  }
  *(void **)(piVar8 + 2) = pvVar10;
  piVar8[1] = iVar5;
  memset(pvVar10,0,sVar15);
  iVar18 = vStop->nSize;
  if (0 < (long)iVar18) {
    piVar4 = vStop->pArray;
    lVar9 = 0;
    do {
      iVar1 = piVar4[lVar9];
      if (((long)iVar1 < 0) || (iVar5 <= iVar1)) goto LAB_0082e85d;
      *(undefined4 *)((long)pvVar10 + (long)iVar1 * 4) = 1;
      lVar9 = lVar9 + 1;
    } while (iVar18 != lVar9);
  }
  if ((fAddPis != 0) && (iVar18 = p->nTruePis, 0 < (long)iVar18)) {
    pVVar12 = p->vCis;
    lVar9 = 0;
    do {
      if (pVVar12->nSize <= lVar9) goto LAB_0082e89b;
      iVar1 = *(int *)((long)pVVar12->pArray[lVar9] + 0x24);
      if (((long)iVar1 < 0) || (iVar5 <= iVar1)) {
LAB_0082e85d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)pvVar10 + (long)iVar1 * 4) = 1;
      lVar9 = lVar9 + 1;
    } while (iVar18 != lVar9);
  }
  if (uVar14 == (uint)local_80) {
    if ((int)(uint)local_80 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar7;
      pVVar6->nCap = 0x10;
    }
    else {
      sVar15 = (ulong)((uint)local_80 * 2) * 8;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(sVar15);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,sVar15);
      }
      pVVar6->pArray = ppvVar7;
      pVVar6->nCap = (uint)local_80 * 2;
    }
  }
  else {
    ppvVar7 = pVVar6->pArray;
  }
  uVar13 = uVar14 + 1;
  pVVar6->nSize = uVar13;
  ppvVar7[(int)uVar14] = piVar8;
  pVVar12 = p->vObjs;
  if (iVar5 != pVVar12->nSize) {
    __assert_fail("nSize == Aig_ManObjNumMax(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Image.c"
                  ,0x53,
                  "Vec_Ptr_t *Llb_ImgSupports(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                 );
  }
  if (0 < iVar5 && fVerbose != 0) {
    uVar19 = 0;
    do {
      piVar8 = (int *)pVVar12->pArray[uVar19];
      if (piVar8 != (int *)0x0) {
        uVar17 = 0;
        iVar18 = 0;
        do {
          if ((long)*(int *)((long)pVVar6->pArray[uVar17] + 4) <= (long)uVar19) goto LAB_0082e87c;
          iVar18 = iVar18 + *(int *)(*(long *)((long)pVVar6->pArray[uVar17] + 8) + uVar19 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
        if (iVar18 != 0) {
          printf("Obj = %4d : ",uVar19 & 0xffffffff);
          uVar14 = (uint)*(undefined8 *)(piVar8 + 6) & 7;
          if (uVar14 == 3) {
            __format = "li  ";
            if (*piVar8 < p->nTruePos) goto LAB_0082e7db;
LAB_0082e7ed:
            printf(__format);
          }
          else {
            if (uVar14 == 2) {
              __format = "lo  ";
              if (*piVar8 < p->nTruePis) {
                __format = "pi  ";
              }
              goto LAB_0082e7ed;
            }
LAB_0082e7db:
            __format = "and ";
            if (0xfffffffd < ((uint)*(undefined8 *)(piVar8 + 6) & 7) - 7) goto LAB_0082e7ed;
          }
          ppvVar7 = pVVar6->pArray;
          uVar17 = 0;
          do {
            if ((long)*(int *)((long)ppvVar7[uVar17] + 4) <= (long)uVar19) {
LAB_0082e87c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("%d");
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
          putchar(10);
          pVVar12 = p->vObjs;
        }
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)pVVar12->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Llb_ImgSupports( Aig_Man_t * p, Vec_Ptr_t * vDdMans, Vec_Int_t * vStart, Vec_Int_t * vStop, int fAddPis, int fVerbose )
{
    Vec_Ptr_t * vSupps;
    Vec_Int_t * vOne;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bSupp, * bTemp;
    int i, Entry, nSize;
    nSize  = Cudd_ReadSize( (DdManager *)Vec_PtrEntry( vDdMans, 0 ) );
    vSupps = Vec_PtrAlloc( 100 );
    // create initial
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStart, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    Vec_PtrPush( vSupps, vOne );
    // create intermediate 
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        vOne  = Vec_IntStart( nSize );
        bSupp = Cudd_Support( dd, dd->bFunc );  Cudd_Ref( bSupp );
        for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
            Vec_IntWriteEntry( vOne, bTemp->index, 1 );
        Cudd_RecursiveDeref( dd, bSupp );
        Vec_PtrPush( vSupps, vOne );
    }
    // create final
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStop, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    if ( fAddPis )
        Saig_ManForEachPi( p, pObj, i )
            Vec_IntWriteEntry( vOne, Aig_ObjId(pObj), 1 );
    Vec_PtrPush( vSupps, vOne );

    // print supports
    assert( nSize == Aig_ManObjNumMax(p) );
    if ( !fVerbose )
        return vSupps;
    Aig_ManForEachObj( p, pObj, i )
    {
        int k, Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            Counter += Vec_IntEntry(vOne, i);
        if ( Counter == 0 ) 
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Saig_ObjIsLi(p,pObj) )
            printf( "li  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            printf( "%d", Vec_IntEntry(vOne, i) );
        printf( "\n" );
    }
    return vSupps;
}